

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

int lws_handshake_server(lws *wsi,uchar **buf,size_t len)

{
  allocated_headers *paVar1;
  char *__s;
  size_t sVar2;
  undefined8 uri_ptr;
  lws_parser_return_t lVar3;
  int iVar4;
  uint code;
  char *pcVar5;
  lws_vhost *vh;
  lws_http_mount *hit;
  char *pcVar6;
  lws_h2_netconn *plVar7;
  size_t sVar8;
  uchar *puVar9;
  int *in_R9;
  lws_protocol_vhost_options *plVar10;
  int i;
  int uri_len;
  size_t local_1e0;
  lws_context_per_thread *local_1d8;
  lws_context *local_1d0;
  uchar *local_1c8;
  int ha;
  char tbuf [128];
  
  local_1d0 = lws_get_context(wsi);
  if (9999999 < len) {
    _lws_log(1,"%s: assert: len %ld\n","lws_handshake_server",len);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/roles/http/server/server.c"
                  ,0x873,"int lws_handshake_server(struct lws *, unsigned char **, size_t)");
  }
  local_1e0 = len;
  if ((wsi->http).ah == (allocated_headers *)0x0) {
    _lws_log(1,"%s: assert: NULL ah\n","lws_handshake_server");
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/roles/http/server/server.c"
                  ,0x878,"int lws_handshake_server(struct lws *, unsigned char **, size_t)");
  }
  local_1d8 = local_1d0->pt + wsi->tsi;
  puVar9 = *buf;
  local_1c8 = puVar9;
  do {
    if (len == 0) {
      return 0;
    }
    if (((wsi->wsistate >> 0x1d & 1) == 0) ||
       (wsi->role_ops != &role_ops_h2 && wsi->role_ops != &role_ops_h1)) {
      _lws_log(1,"%s: bad wsi role 0x%x\n","lws_handshake_server",
               (ulong)(wsi->wsistate & 0xffff0000));
      goto LAB_0011c811;
    }
    iVar4 = (int)len;
    i = iVar4;
    lVar3 = lws_parse(wsi,puVar9,&i);
    _lws_log(8,"%s: parsed count %d\n","lws_handshake_server",(ulong)(uint)(iVar4 - i));
    len = (size_t)(uint)i;
    puVar9 = *buf + (iVar4 - i);
    *buf = puVar9;
    if (lVar3 != LPR_OK) {
      if (lVar3 == LPR_DO_FALLBACK) goto LAB_0011c7dd;
      pcVar5 = "lws_parse failed\n";
      goto LAB_0011c6b9;
    }
    paVar1 = (wsi->http).ah;
    if (paVar1 == (allocated_headers *)0x0) goto LAB_0011c811;
  } while (paVar1->parser_state != 'e');
  _lws_log(0x20,"%s: lws_parse sees parsing complete\n","lws_handshake_server");
  if ((((wsi->a).vhost)->listen_port == 0) ||
     (iVar4 = lws_hdr_total_length(wsi,WSI_TOKEN_HOST), iVar4 == 0)) {
    _lws_log(8,"no host\n");
  }
  else {
    iVar4 = ((wsi->a).vhost)->listen_port;
    pcVar5 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_HOST);
    vh = lws_select_vhost(local_1d0,iVar4,pcVar5);
    if (vh != (lws_vhost *)0x0) {
      lws_vhost_bind_wsi(vh,wsi);
    }
  }
  if (((wsi->role_ops != &role_ops_h2) || ((wsi->wsistate & 0x20000000) == 0)) &&
     (-1 < (short)*(ulong *)&wsi->field_0x46e)) {
    *(ulong *)&wsi->field_0x46e = *(ulong *)&wsi->field_0x46e | 0x8000;
  }
  plVar10 = ((wsi->a).context)->reject_service_keywords;
  if ((plVar10 != (lws_protocol_vhost_options *)0x0) &&
     (iVar4 = lws_hdr_copy(wsi,tbuf,0x17f,WSI_TOKEN_HTTP_USER_AGENT), 0 < iVar4)) {
    for (; plVar10 != (lws_protocol_vhost_options *)0x0; plVar10 = plVar10->next) {
      pcVar5 = strstr(tbuf,plVar10->name);
      if (pcVar5 != (char *)0x0) {
        __s = plVar10->value;
        pcVar6 = strchr(__s,0x20);
        pcVar5 = pcVar6 + 1;
        if (pcVar6 == (char *)0x0) {
          pcVar5 = (char *)0x0;
        }
        code = atoi(__s);
        lws_return_http_status(wsi,code,pcVar5);
        goto LAB_0011c811;
      }
    }
  }
  uri_len = 0;
  tbuf[0] = '\0';
  tbuf[1] = '\0';
  tbuf[2] = '\0';
  tbuf[3] = '\0';
  tbuf[4] = '\0';
  tbuf[5] = '\0';
  tbuf[6] = '\0';
  tbuf[7] = '\0';
  iVar4 = lws_http_get_uri_and_method(wsi,(char **)tbuf,&uri_len);
  uri_ptr = tbuf._0_8_;
  if (((-1 < iVar4) &&
      (hit = lws_find_mount(wsi,(char *)tbuf._0_8_,uri_len), hit != (lws_http_mount *)0x0)) &&
     (iVar4 = lws_http_redirect_hit(local_1d8,wsi,hit,(char *)uri_ptr,(int)&ha,in_R9), ha != 0)) {
    return iVar4;
  }
  iVar4 = lws_hdr_total_length(wsi,WSI_TOKEN_CONNECT);
  if (iVar4 == 0) {
    lwsi_set_state(wsi,0x20a);
    lws_set_timeout(wsi,NO_PENDING_TIMEOUT,0);
    iVar4 = lws_hdr_total_length(wsi,WSI_TOKEN_UPGRADE);
    if (iVar4 == 0) {
LAB_0011c9a0:
      pcVar5 = lws_wsi_tag(wsi);
      _lws_log(8,"%s: %s: No upgrade\n","lws_handshake_server",pcVar5);
      lwsi_set_state(wsi,0x119);
      (wsi->http).fop_fd = (lws_fop_fd_t)0x0;
      pcVar5 = lws_wsi_tag(wsi);
      _lws_log(0x10,"%s: %s: ah %p\n","lws_handshake_server",pcVar5,(wsi->http).ah);
      iVar4 = lws_http_action(wsi);
      return iVar4;
    }
    pcVar5 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_UPGRADE);
    iVar4 = strcasecmp(pcVar5,"websocket");
    if ((iVar4 != 0) && (iVar4 = strcasecmp(pcVar5,"h2c"), iVar4 != 0)) {
      _lws_log(8,"Unknown upgrade \'%s\'\n",pcVar5);
      iVar4 = lws_return_http_status(wsi,0x193,(char *)0x0);
      if ((iVar4 != 0) || (iVar4 = lws_http_transaction_completed(wsi), iVar4 != 0))
      goto LAB_0011c811;
    }
    iVar4 = user_callback_handle_rxflow
                      (((wsi->a).protocol)->callback,wsi,LWS_CALLBACK_HTTP_CONFIRM_UPGRADE,
                       wsi->user_space,pcVar5,0);
    if (-1 < iVar4) {
      if (iVar4 == 0) {
        if (((((wsi->a).vhost)->options & 0x8000000) == 0) ||
           (iVar4 = lws_confirm_host_header(wsi), iVar4 == 0)) {
          iVar4 = strcasecmp(pcVar5,"websocket");
          if (iVar4 == 0) {
            _lws_log(8,"Upgrade to ws\n");
            iVar4 = lws_process_ws_upgrade(wsi);
            if (iVar4 == 0) {
              return 0;
            }
          }
          else {
            iVar4 = strcasecmp(pcVar5,"h2c");
            if (iVar4 != 0) goto LAB_0011c9a0;
            _lws_log(8,"Upgrade to h2c\n");
            iVar4 = lws_hdr_total_length(wsi,WSI_TOKEN_HTTP2_SETTINGS);
            if (iVar4 != 0) {
              _lws_log(8,"h2c upgrade...\n");
              pcVar5 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_HTTP2_SETTINGS);
              iVar4 = lws_b64_decode_string(pcVar5,tbuf,0x80);
              if (iVar4 < 0) {
                _lws_log(0x20,"HTTP2_SETTINGS too long\n");
                return 1;
              }
              wsi->field_0x46e = wsi->field_0x46e | 4;
              paVar1 = (wsi->http).ah;
              lws_role_transition(wsi,0x20000000,LRS_H2_AWAIT_PREFACE,&role_ops_h2);
              (wsi->http).ah = paVar1;
              if ((wsi->h2).h2n == (lws_h2_netconn *)0x0) {
                plVar7 = (lws_h2_netconn *)lws_zalloc(0xf8,"h2n");
                (wsi->h2).h2n = plVar7;
                if (plVar7 == (lws_h2_netconn *)0x0) {
                  return 1;
                }
              }
              lws_h2_init(wsi);
              lws_h2_settings(wsi,&((wsi->h2).h2n)->peer_set,(uchar *)tbuf,iVar4);
              lws_hpack_dynamic_size(wsi,(((wsi->h2).h2n)->peer_set).s[1]);
              memcpy(tbuf,
                     "HTTP/1.1 101 Switching Protocols\r\nConnection: Upgrade\r\nUpgrade: h2c\r\n\r\n"
                     ,0x48);
              sVar8 = strlen(tbuf);
              iVar4 = lws_issue_raw(wsi,(uchar *)tbuf,sVar8 & 0xffffffff);
              if (iVar4 == (int)sVar8) {
                return 0;
              }
              _lws_log(0x10,"http2 switch: ERROR writing to socket\n");
              return 1;
            }
            pcVar5 = "missing http2_settings\n";
LAB_0011c6b9:
            _lws_log(8,pcVar5);
          }
        }
      }
      else {
        iVar4 = lws_http_transaction_completed(wsi);
        if (iVar4 == 0) {
          return 0;
        }
      }
    }
  }
  else {
    _lws_log(8,"Changing to RAW mode\n");
LAB_0011c7dd:
    puVar9 = local_1c8;
    sVar2 = local_1e0;
    iVar4 = lws_http_to_fallback(wsi,local_1c8,local_1e0);
    if (iVar4 == 0) {
      *buf = puVar9 + sVar2;
      return 0;
    }
    _lws_log(8,"%s: fallback -> close\n","lws_handshake_server");
  }
LAB_0011c811:
  lws_header_table_detach(wsi,1);
  return 1;
}

Assistant:

int
lws_handshake_server(struct lws *wsi, unsigned char **buf, size_t len)
{
	struct lws_context *context = lws_get_context(wsi);
	struct lws_context_per_thread *pt = &context->pt[(int)wsi->tsi];
#if defined(LWS_WITH_HTTP2)
	struct allocated_headers *ah;
#endif
	unsigned char *obuf = *buf;
#if defined(LWS_WITH_HTTP2)
	char tbuf[128], *p;
#endif
	size_t olen = len;
	int n = 0, m, i;

	if (len >= 10000000) {
		lwsl_err("%s: assert: len %ld\n", __func__, (long)len);
		assert(0);
	}

	if (!wsi->http.ah) {
		lwsl_err("%s: assert: NULL ah\n", __func__);
		assert(0);
	}

	while (len) {
		if (!lwsi_role_server(wsi) || !lwsi_role_http(wsi)) {
			lwsl_err("%s: bad wsi role 0x%x\n", __func__,
					(int)lwsi_role(wsi));
			goto bail_nuke_ah;
		}

		i = (int)len;
		m = lws_parse(wsi, *buf, &i);
		lwsl_info("%s: parsed count %d\n", __func__, (int)len - i);
		(*buf) += (int)len - i;
		len = (unsigned int)i;

		if (m == LPR_DO_FALLBACK) {

			/*
			 * http parser went off the rails and
			 * LWS_SERVER_OPTION_FALLBACK_TO_APPLY_LISTEN_
			 * ACCEPT_CONFIG is set on this vhost.
			 *
			 * We are transitioning from http with an AH, to
			 * a backup role (raw-skt, by default).  Drop
			 * the ah, bind to the role with mode as
			 * ESTABLISHED.
			 */
raw_transition:

			if (lws_http_to_fallback(wsi, obuf, olen)) {
				lwsl_info("%s: fallback -> close\n", __func__);
				goto bail_nuke_ah;
			}

			(*buf) = obuf + olen;

			return 0;
		}
		if (m) {
			lwsl_info("lws_parse failed\n");
			goto bail_nuke_ah;
		}

		/* coverity... */
		if (!wsi->http.ah)
			goto bail_nuke_ah;

		if (wsi->http.ah->parser_state != WSI_PARSING_COMPLETE)
			continue;

		lwsl_parser("%s: lws_parse sees parsing complete\n", __func__);

		/* select vhost */

		if (wsi->a.vhost->listen_port &&
		    lws_hdr_total_length(wsi, WSI_TOKEN_HOST)) {
			struct lws_vhost *vhost = lws_select_vhost(
				context, wsi->a.vhost->listen_port,
				lws_hdr_simple_ptr(wsi, WSI_TOKEN_HOST));

			if (vhost)
				lws_vhost_bind_wsi(vhost, wsi);
		} else
			lwsl_info("no host\n");

		if ((!lwsi_role_h2(wsi) || !lwsi_role_server(wsi)) &&
		    (!wsi->conn_stat_done))
			wsi->conn_stat_done = 1;

		/* check for unwelcome guests */
#if defined(LWS_WITH_HTTP_UNCOMMON_HEADERS)
		if (wsi->a.context->reject_service_keywords) {
			const struct lws_protocol_vhost_options *rej =
					wsi->a.context->reject_service_keywords;
			char ua[384], *msg = NULL;

			if (lws_hdr_copy(wsi, ua, sizeof(ua) - 1,
					 WSI_TOKEN_HTTP_USER_AGENT) > 0) {
#ifdef LWS_WITH_ACCESS_LOG
				char *uri_ptr = NULL;
				int meth, uri_len;
#endif
				ua[sizeof(ua) - 1] = '\0';
				while (rej) {
					if (!strstr(ua, rej->name)) {
						rej = rej->next;
						continue;
					}

					msg = strchr(rej->value, ' ');
					if (msg)
						msg++;
					lws_return_http_status(wsi,
						(unsigned int)atoi(rej->value), msg);
#ifdef LWS_WITH_ACCESS_LOG
					meth = lws_http_get_uri_and_method(wsi,
							&uri_ptr, &uri_len);
					if (meth >= 0)
						lws_prepare_access_log_info(wsi,
							uri_ptr, uri_len, meth);

					/* wsi close will do the log */
#endif
					/*
					 * We don't want anything from
					 * this rejected guy.  Follow
					 * the close flow, not the
					 * transaction complete flow.
					 */
					goto bail_nuke_ah;
				}
			}
		}
#endif
		/*
		 * So he may have come to us requesting one or another kind
		 * of upgrade from http... but we may want to redirect him at
		 * http level.  In that case, we need to check the redirect
		 * situation even though he's not actually wanting http and
		 * prioritize returning that if there is one.
		 */

		{
			const struct lws_http_mount *hit = NULL;
			int uri_len = 0, ha, n;
			char *uri_ptr = NULL;

			n = lws_http_get_uri_and_method(wsi, &uri_ptr, &uri_len);
			if (n >= 0) {
				hit = lws_find_mount(wsi, uri_ptr, uri_len);
				if (hit) {
					n = lws_http_redirect_hit(pt, wsi, hit, uri_ptr,
								  uri_len, &ha);
					if (ha)
						return n;
				}
			}
		}



		if (lws_hdr_total_length(wsi, WSI_TOKEN_CONNECT)) {
			lwsl_info("Changing to RAW mode\n");
			goto raw_transition;
		}

		lwsi_set_state(wsi, LRS_PRE_WS_SERVING_ACCEPT);
		lws_set_timeout(wsi, NO_PENDING_TIMEOUT, 0);

		if (lws_hdr_total_length(wsi, WSI_TOKEN_UPGRADE)) {

			const char *up = lws_hdr_simple_ptr(wsi,
							    WSI_TOKEN_UPGRADE);

			if (strcasecmp(up, "websocket") &&
			    strcasecmp(up, "h2c")) {
				lwsl_info("Unknown upgrade '%s'\n", up);

				if (lws_return_http_status(wsi,
						HTTP_STATUS_FORBIDDEN, NULL) ||
				    lws_http_transaction_completed(wsi))
					goto bail_nuke_ah;
			}

			n = user_callback_handle_rxflow(wsi->a.protocol->callback,
					wsi, LWS_CALLBACK_HTTP_CONFIRM_UPGRADE,
					wsi->user_space, (char *)up, 0);

			/* just hang up? */

			if (n < 0)
				goto bail_nuke_ah;

			/* callback returned headers already, do t_c? */

			if (n > 0) {
				if (lws_http_transaction_completed(wsi))
					goto bail_nuke_ah;

				/* continue on */

				return 0;
			}

			/* callback said 0, it was allowed */

			if (wsi->a.vhost->options &
			    LWS_SERVER_OPTION_VHOST_UPG_STRICT_HOST_CHECK &&
			    lws_confirm_host_header(wsi))
				goto bail_nuke_ah;

			if (!strcasecmp(up, "websocket")) {
#if defined(LWS_ROLE_WS)
				lws_metrics_tag_wsi_add(wsi, "upg", "ws");
				lwsl_info("Upgrade to ws\n");
				goto upgrade_ws;
#endif
			}
#if defined(LWS_WITH_HTTP2)
			if (!strcasecmp(up, "h2c")) {
				lws_metrics_tag_wsi_add(wsi, "upg", "h2c");
				lwsl_info("Upgrade to h2c\n");
				goto upgrade_h2c;
			}
#endif
		}

		/* no upgrade ack... he remained as HTTP */

		lwsl_info("%s: %s: No upgrade\n", __func__, lws_wsi_tag(wsi));

		lwsi_set_state(wsi, LRS_ESTABLISHED);
#if defined(LWS_WITH_FILE_OPS)
		wsi->http.fop_fd = NULL;
#endif

#if defined(LWS_WITH_HTTP_STREAM_COMPRESSION)
		lws_http_compression_validate(wsi);
#endif

		lwsl_debug("%s: %s: ah %p\n", __func__, lws_wsi_tag(wsi),
			   (void *)wsi->http.ah);

		n = lws_http_action(wsi);

		return n;

#if defined(LWS_WITH_HTTP2)
upgrade_h2c:
		if (!lws_hdr_total_length(wsi, WSI_TOKEN_HTTP2_SETTINGS)) {
			lwsl_info("missing http2_settings\n");
			goto bail_nuke_ah;
		}

		lwsl_info("h2c upgrade...\n");

		p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP2_SETTINGS);
		/* convert the peer's HTTP-Settings */
		n = lws_b64_decode_string(p, tbuf, sizeof(tbuf));
		if (n < 0) {
			lwsl_parser("HTTP2_SETTINGS too long\n");
			return 1;
		}

		wsi->upgraded_to_http2 = 1;

		/* adopt the header info */

		ah = wsi->http.ah;
		lws_role_transition(wsi, LWSIFR_SERVER, LRS_H2_AWAIT_PREFACE,
				    &role_ops_h2);

		/* http2 union member has http union struct at start */
		wsi->http.ah = ah;

		if (!wsi->h2.h2n) {
			wsi->h2.h2n = lws_zalloc(sizeof(*wsi->h2.h2n), "h2n");
			if (!wsi->h2.h2n)
				return 1;
		}

		lws_h2_init(wsi);

		/* HTTP2 union */

		lws_h2_settings(wsi, &wsi->h2.h2n->peer_set, (uint8_t *)tbuf, n);

		lws_hpack_dynamic_size(wsi, (int)wsi->h2.h2n->peer_set.s[
		                                      H2SET_HEADER_TABLE_SIZE]);

		strcpy(tbuf, "HTTP/1.1 101 Switching Protocols\x0d\x0a"
			      "Connection: Upgrade\x0d\x0a"
			      "Upgrade: h2c\x0d\x0a\x0d\x0a");
		m = (int)strlen(tbuf);
		n = lws_issue_raw(wsi, (unsigned char *)tbuf, (unsigned int)m);
		if (n != m) {
			lwsl_debug("http2 switch: ERROR writing to socket\n");
			return 1;
		}

		return 0;
#endif
#if defined(LWS_ROLE_WS)
upgrade_ws:
		if (lws_process_ws_upgrade(wsi))
			goto bail_nuke_ah;

		return 0;
#endif
	} /* while all chars are handled */

	return 0;

bail_nuke_ah:
	/* drop the header info */
	lws_header_table_detach(wsi, 1);

	return 1;
}